

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_NE_COLLECTIONS_Test *this)

{
  Fixed *pFVar1;
  int *piVar2;
  AssertionResult iutest_ar;
  iuCodeMessage local_218;
  int a [5];
  int local_1d4 [3];
  int b [5];
  int local_1b4 [3];
  Fixed local_1a8;
  
  a[0] = 0;
  a[1] = 1;
  a[2] = 2;
  a[3] = 3;
  a[4] = 4;
  b[0] = 0;
  b[1] = 2;
  b[2] = 2;
  b[3] = 3;
  b[4] = a[4];
  iuutil::CmpHelperNeCollections<int*,int*>
            (&iutest_ar,(iuutil *)0x31d74e,"a+(sizeof(a)/sizeof(a[0]))","b",
             "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,local_1b4,(int *)0x4);
  if (iutest_ar.m_result == false) {
    memset(&local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a8);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,5);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x54,iutest_ar.m_message._M_dataplus._M_p);
    local_218._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,pFVar1);
  }
  else {
    piVar2 = (int *)0x2fd9ae;
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x31d74e,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,local_1b4,piVar2);
    if (iutest_ar.m_result == false) {
      memset(&local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1a8);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,5);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x56,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,pFVar1);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1a8);
    }
    piVar2 = (int *)0x2fda70;
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x31d74e,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,local_1b4,piVar2);
    if (iutest_ar.m_result == false) {
      memset(&local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1a8);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,5);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0x58,iutest_ar.m_message._M_dataplus._M_p);
      local_218._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,pFVar1);
      std::__cxx11::string::~string((string *)&local_218);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_1a8);
    }
    piVar2 = (int *)0x2fdb2f;
    std::__cxx11::string::~string((string *)&iutest_ar);
    iuutil::CmpHelperNeCollections<int*,int*>
              (&iutest_ar,(iuutil *)0x31d74e,"a+(sizeof(a)/sizeof(a[0]))","b",
               "b+(sizeof(b)/sizeof(b[0]))",(char *)a,local_1d4,b,local_1b4,piVar2);
    if (iutest_ar.m_result != false) goto LAB_002fdc4d;
    memset(&local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a8);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a8,5);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x5a,iutest_ar.m_message._M_dataplus._M_p);
    local_218._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_218,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_218);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_1a8);
LAB_002fdc4d:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

TEST(GTestSyntaxTest, NE_COLLECTIONS)
{
    int a[] = { 0, 1, 2, 3, 4 };
    int b[] = { 0, 2, 2, 3, 4 };

    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSERT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        EXPECT_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        INFORM_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
    if( int size = (sizeof(a)/sizeof(a[0])) )
        ASSUME_NE_COLLECTIONS(a, a+(sizeof(a)/sizeof(a[0])), b, b+(sizeof(b)/sizeof(b[0]))) << size;
}